

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O0

bool __thiscall
QOpenGLProgramBinaryCache::load(QOpenGLProgramBinaryCache *this,QByteArray *cacheKey,uint programId)

{
  QByteArray *pQVar1;
  bool bVar2;
  MemCacheEntry *pMVar3;
  qint64 qVar4;
  qsizetype qVar5;
  long cost;
  qsizetype qVar6;
  QByteArray *key;
  void *p_00;
  MemCacheEntry *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  quint32 blobSize;
  quint32 blobFormat;
  qint64 bytesRead;
  MemCacheEntry *e;
  QByteArray version;
  QByteArray renderer;
  QByteArray vendor;
  GLEnvInfo info;
  R map;
  uchar *p;
  FdWrapper fdw;
  QString fn;
  QByteArray buf;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  DeferredFileRemove undertaker;
  QMutexLocker<QMutex> lock;
  char header [16];
  DeferredFileRemove *in_stack_fffffffffffffd68;
  uint in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  QOpenGLProgramBinaryCache *in_stack_fffffffffffffd78;
  QMessageLogger *in_stack_fffffffffffffd80;
  QByteArray *in_stack_fffffffffffffd88;
  GLEnvInfo *in_stack_fffffffffffffd90;
  uint blobSize_00;
  QOpenGLProgramBinaryCache *in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  QOpenGLProgramBinaryCache *in_stack_fffffffffffffda8;
  QOpenGLProgramBinaryCache *this_00;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  bool local_1e9;
  QDebug local_1c8;
  QByteArray local_1c0 [2];
  QDebug local_188;
  QByteArray local_180 [2];
  QDebug local_148;
  QByteArray local_140;
  undefined1 local_128 [72];
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  int local_ac;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 local_48 [32];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (QMutex *)in_stack_fffffffffffffd68);
  pMVar3 = QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::object
                     ((QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry> *)
                      CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                      (QByteArray *)in_stack_fffffffffffffd68);
  if (pMVar3 == (MemCacheEntry *)0x0) {
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)0x910b31);
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    cacheFileName(in_stack_fffffffffffffd98,&in_stack_fffffffffffffd90->glvendor);
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    DeferredFileRemove::DeferredFileRemove
              ((DeferredFileRemove *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               &in_stack_fffffffffffffd68->fn);
    local_ac = -0x55555556;
    FdWrapper::FdWrapper
              ((FdWrapper *)in_stack_fffffffffffffd80,&in_stack_fffffffffffffd78->m_globalCacheDir);
    if (local_ac == -1) {
      local_1e9 = false;
    }
    else {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      qVar4 = qt_safe_read((int)((ulong)in_stack_fffffffffffffd80 >> 0x20),in_stack_fffffffffffffd78
                           ,CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      if (qVar4 == 0x10) {
        QByteArray::fromRawData
                  ((char *)in_stack_fffffffffffffd88,(qsizetype)in_stack_fffffffffffffd80);
        QByteArray::operator=
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (QByteArray *)in_stack_fffffffffffffd68);
        QByteArray::~QByteArray((QByteArray *)0x910c8d);
      }
      bVar2 = verifyHeader(in_stack_fffffffffffffd78,
                           (QByteArray *)
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      if (bVar2) {
        local_d0 = &DAT_aaaaaaaaaaaaaaaa;
        local_e0 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8 = &DAT_aaaaaaaaaaaaaaaa;
        FdWrapper::map((FdWrapper *)in_stack_fffffffffffffd98);
        bVar2 = FdWrapper::map()::R::operator_cast_to_bool((R *)&local_e0);
        if (bVar2) {
          local_d0 = local_d8 + 0x10;
          memset(local_128,0xaa,0x48);
          anon_unknown.dwarf_175eb32::GLEnvInfo::GLEnvInfo(in_stack_fffffffffffffd90);
          local_140.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_140.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          local_140.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          readStr((uchar **)in_stack_fffffffffffffd78);
          bVar2 = ::operator!=(in_stack_fffffffffffffd88,(QByteArray *)in_stack_fffffffffffffd80);
          if (bVar2) {
            local_58 = &DAT_aaaaaaaaaaaaaaaa;
            local_50 = &DAT_aaaaaaaaaaaaaaaa;
            QtPrivateLogging::lcOpenGLProgramDiskCache();
            anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
            QLoggingCategoryMacroHolder
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       (QLoggingCategory *)in_stack_fffffffffffffd68);
            while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                     ((QLoggingCategoryMacroHolder *)&local_58), bVar2) {
              anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x910e31);
              QMessageLogger::QMessageLogger
                        (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                         in_stack_fffffffffffffd74,(char *)in_stack_fffffffffffffd68,
                         (char *)0x910e4a);
              QMessageLogger::debug();
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffd88,
                                 (char *)CONCAT17(in_stack_fffffffffffffdbf,
                                                  in_stack_fffffffffffffdb8));
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffd80,
                                 (QByteArray *)in_stack_fffffffffffffd78);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffd80,
                                 (QByteArray *)in_stack_fffffffffffffd78);
              QDebug::~QDebug(&local_148);
              local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
            }
            DeferredFileRemove::setActive((DeferredFileRemove *)local_48);
            local_1e9 = false;
          }
          else {
            local_180[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_180[0].d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            local_180[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            readStr((uchar **)in_stack_fffffffffffffd78);
            bVar2 = ::operator!=(in_stack_fffffffffffffd88,(QByteArray *)in_stack_fffffffffffffd80);
            if (bVar2) {
              local_68 = &DAT_aaaaaaaaaaaaaaaa;
              local_60 = &DAT_aaaaaaaaaaaaaaaa;
              QtPrivateLogging::lcOpenGLProgramDiskCache();
              anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
              QLoggingCategoryMacroHolder
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                         CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                         (QLoggingCategory *)in_stack_fffffffffffffd68);
              while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                             operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_68), bVar2)
              {
                anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                          ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x910f8c);
                QMessageLogger::QMessageLogger
                          (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                           in_stack_fffffffffffffd74,(char *)in_stack_fffffffffffffd68,
                           (char *)0x910fa5);
                QMessageLogger::debug();
                QDebug::operator<<((QDebug *)in_stack_fffffffffffffd88,
                                   (char *)CONCAT17(in_stack_fffffffffffffdbf,
                                                    in_stack_fffffffffffffdb8));
                QDebug::operator<<((QDebug *)in_stack_fffffffffffffd80,
                                   (QByteArray *)in_stack_fffffffffffffd78);
                QDebug::operator<<((QDebug *)in_stack_fffffffffffffd80,
                                   (QByteArray *)in_stack_fffffffffffffd78);
                QDebug::~QDebug(&local_188);
                local_60 = (undefined1 *)((ulong)local_60 & 0xffffffffffffff00);
              }
              DeferredFileRemove::setActive((DeferredFileRemove *)local_48);
              local_1e9 = false;
            }
            else {
              local_1c0[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_1c0[0].d.ptr = &DAT_aaaaaaaaaaaaaaaa;
              local_1c0[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              readStr((uchar **)in_stack_fffffffffffffd78);
              bVar2 = ::operator!=(in_stack_fffffffffffffd88,(QByteArray *)in_stack_fffffffffffffd80
                                  );
              if (bVar2) {
                local_78 = &DAT_aaaaaaaaaaaaaaaa;
                local_70 = &DAT_aaaaaaaaaaaaaaaa;
                QtPrivateLogging::lcOpenGLProgramDiskCache();
                anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
                QLoggingCategoryMacroHolder
                          ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                           (QLoggingCategory *)in_stack_fffffffffffffd68);
                while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                               operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_78),
                      bVar2) {
                  anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x9110eb);
                  QMessageLogger::QMessageLogger
                            (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                             in_stack_fffffffffffffd74,(char *)in_stack_fffffffffffffd68,
                             (char *)0x911104);
                  QMessageLogger::debug();
                  QDebug::operator<<((QDebug *)in_stack_fffffffffffffd88,
                                     (char *)CONCAT17(in_stack_fffffffffffffdbf,
                                                      in_stack_fffffffffffffdb8));
                  QDebug::operator<<((QDebug *)in_stack_fffffffffffffd80,
                                     (QByteArray *)in_stack_fffffffffffffd78);
                  QDebug::operator<<((QDebug *)in_stack_fffffffffffffd80,
                                     (QByteArray *)in_stack_fffffffffffffd78);
                  QDebug::~QDebug(&local_1c8);
                  local_70 = (undefined1 *)((ulong)local_70 & 0xffffffffffffff00);
                }
                DeferredFileRemove::setActive((DeferredFileRemove *)local_48);
                local_1e9 = false;
              }
              else {
                readUInt((uchar **)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
                readUInt((uchar **)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
                qVar5 = QByteArray::size(&local_140);
                cost = qVar5 + 0x1c;
                qVar5 = QByteArray::size(local_180);
                pMVar3 = (MemCacheEntry *)(cost + qVar5);
                qVar5 = QByteArray::size(local_1c0);
                pQVar1 = &pMVar3->blob;
                qVar6 = QByteArray::size(&local_140);
                key = (QByteArray *)(qVar6 + 0x1c);
                qVar6 = QByteArray::size(local_180);
                this_00 = (QOpenGLProgramBinaryCache *)((long)&(key->d).d + qVar6);
                qVar6 = QByteArray::size(local_1c0);
                local_d0 = local_d0 +
                           (((long)&(pQVar1->d).ptr + qVar5 + 3 & 0xfffffffffffffffcU) -
                           ((long)&(this_00->m_globalCacheDir).d.ptr + qVar6));
                bVar2 = setProgramBinary(this_00,(uint)((ulong)key >> 0x20),(uint)key,pMVar3,
                                         (uint)((ulong)cost >> 0x20));
                local_1e9 = false;
                if (bVar2) {
                  p_00 = (void *)(in_RDI + 0x50);
                  operator_new(0x20);
                  MemCacheEntry::MemCacheEntry
                            (in_RSI,p_00,in_stack_fffffffffffffd74,in_stack_fffffffffffffd70);
                  local_1e9 = QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::insert
                                        ((QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>
                                          *)this_00,key,pMVar3,cost);
                }
              }
              QByteArray::~QByteArray((QByteArray *)0x91132a);
            }
            QByteArray::~QByteArray((QByteArray *)0x911337);
          }
          QByteArray::~QByteArray((QByteArray *)0x911344);
          anon_unknown.dwarf_175eb32::GLEnvInfo::~GLEnvInfo
                    ((GLEnvInfo *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        }
        else {
          DeferredFileRemove::setActive((DeferredFileRemove *)local_48);
          local_1e9 = false;
        }
        FdWrapper::map::R::~R((R *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      }
      else {
        DeferredFileRemove::setActive((DeferredFileRemove *)local_48);
        local_1e9 = false;
      }
    }
    FdWrapper::~FdWrapper
              ((FdWrapper *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    DeferredFileRemove::~DeferredFileRemove(in_stack_fffffffffffffd68);
    QString::~QString((QString *)0x911385);
    QByteArray::~QByteArray((QByteArray *)0x911392);
  }
  else {
    QByteArray::constData((QByteArray *)0x910ab2);
    blobSize_00 = (uint)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    QByteArray::size(&pMVar3->blob);
    local_1e9 = setProgramBinary(in_stack_fffffffffffffda8,
                                 (uint)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                 (uint)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                                 blobSize_00);
  }
  QMutexLocker<QMutex>::~QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1e9;
}

Assistant:

bool QOpenGLProgramBinaryCache::load(const QByteArray &cacheKey, uint programId)
{
    QMutexLocker lock(&m_mutex);
    if (const MemCacheEntry *e = m_memCache.object(cacheKey))
        return setProgramBinary(programId, e->format, e->blob.constData(), e->blob.size());

    QByteArray buf;
    const QString fn = cacheFileName(cacheKey);
    DeferredFileRemove undertaker(fn);
#ifdef Q_OS_UNIX
    FdWrapper fdw(fn);
    if (fdw.fd == -1)
        return false;
    char header[BASE_HEADER_SIZE];
    qint64 bytesRead = qt_safe_read(fdw.fd, header, BASE_HEADER_SIZE);
    if (bytesRead == BASE_HEADER_SIZE)
        buf = QByteArray::fromRawData(header, BASE_HEADER_SIZE);
#else
    QFile f(fn);
    if (!f.open(QIODevice::ReadOnly))
        return false;
    buf = f.read(BASE_HEADER_SIZE);
#endif

    if (!verifyHeader(buf)) {
        undertaker.setActive();
        return false;
    }

    const uchar *p;
#ifdef Q_OS_UNIX
    const auto map = fdw.map();
    if (!map) {
        undertaker.setActive();
        return false;
    }
    p = static_cast<const uchar *>(map.ptr) + BASE_HEADER_SIZE;
#else
    buf = f.readAll();
    p = reinterpret_cast<const uchar *>(buf.constData());
#endif

    GLEnvInfo info;

    QByteArray vendor = readStr(&p);
    if (vendor != info.glvendor) {
        // readStr returns non-null terminated strings just pointing to inside
        // 'p' so must print these via the stream qCDebug and not constData().
        qCDebug(lcOpenGLProgramDiskCache) << "GL_VENDOR does not match" << vendor << info.glvendor;
        undertaker.setActive();
        return false;
    }
    QByteArray renderer = readStr(&p);
    if (renderer != info.glrenderer) {
        qCDebug(lcOpenGLProgramDiskCache) << "GL_RENDERER does not match" << renderer << info.glrenderer;
        undertaker.setActive();
        return false;
    }
    QByteArray version = readStr(&p);
    if (version != info.glversion) {
        qCDebug(lcOpenGLProgramDiskCache) <<  "GL_VERSION does not match" << version << info.glversion;
        undertaker.setActive();
        return false;
    }

    quint32 blobFormat = readUInt(&p);
    quint32 blobSize = readUInt(&p);

    p += PADDING_SIZE(FULL_HEADER_SIZE(vendor.size() + renderer.size() + version.size()));

    return setProgramBinary(programId, blobFormat, p, blobSize)
        && m_memCache.insert(cacheKey, new MemCacheEntry(p, blobSize, blobFormat));
}